

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdCreateExtkey(void *handle,int network_type,int key_type,char *parent_key,char *fingerprint,
                   char *key,char *chain_code,uchar depth,uint32_t child_number,char **extkey)

{
  bool bVar1;
  NetType net_type;
  char *pcVar2;
  CfdException *pCVar3;
  bool is_bitcoin;
  Privkey privkey;
  Privkey parent_privkey;
  string local_150;
  void *local_130;
  string key_str;
  ExtPubkey extpubkey;
  string fingerprint_str;
  string parent_key_str;
  string chain_code_str;
  
  local_130 = handle;
  cfd::Initialize();
  if (extkey == (char **)0x0) {
    extpubkey.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    extpubkey.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x6ad;
    extpubkey.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdCreateExtkey";
    cfd::core::logger::warn<>((CfdSourceLocation *)&extpubkey,"extkey is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&extpubkey,"Failed to parameter. extkey is null.",(allocator *)&key_str);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&extpubkey);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(key);
  if (!bVar1) {
    is_bitcoin = true;
    net_type = cfd::capi::ConvertNetType(network_type,&is_bitcoin);
    if (is_bitcoin != false) {
      std::__cxx11::string::string((string *)&key_str,key,(allocator *)&extpubkey);
      std::__cxx11::string::string((string *)&chain_code_str,chain_code,(allocator *)&extpubkey);
      parent_key_str._M_dataplus._M_p = (pointer)&parent_key_str.field_2;
      parent_key_str._M_string_length = 0;
      parent_key_str.field_2._M_local_buf[0] = '\0';
      bVar1 = cfd::capi::IsEmptyString(parent_key);
      if (!bVar1) {
        std::__cxx11::string::assign((char *)&parent_key_str);
      }
      fingerprint_str._M_dataplus._M_p = (pointer)&fingerprint_str.field_2;
      fingerprint_str._M_string_length = 0;
      fingerprint_str.field_2._M_local_buf[0] = '\0';
      bVar1 = cfd::capi::IsEmptyString(fingerprint);
      if (!bVar1) {
        std::__cxx11::string::assign((char *)&fingerprint_str);
      }
      if (key_type == 0) {
        cfd::core::Privkey::Privkey(&privkey);
        if (key_str._M_string_length == 0x40) {
          cfd::core::Privkey::Privkey((Privkey *)&extpubkey,&key_str,kMainnet,true);
        }
        else {
          cfd::core::Privkey::FromWif((Privkey *)&extpubkey,&key_str,net_type,true);
        }
        cfd::core::Privkey::operator=(&privkey,(Privkey *)&extpubkey);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&extpubkey);
        if (fingerprint_str._M_string_length == 0) {
          cfd::core::Privkey::Privkey(&parent_privkey);
          if (parent_key_str._M_string_length == 0x40) {
            cfd::core::Privkey::Privkey((Privkey *)&extpubkey,&parent_key_str,kMainnet,true);
          }
          else {
            cfd::core::Privkey::FromWif((Privkey *)&extpubkey,&parent_key_str,net_type,true);
          }
          cfd::core::Privkey::operator=(&parent_privkey,(Privkey *)&extpubkey);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&extpubkey);
          cfd::core::ByteData256::ByteData256((ByteData256 *)&local_150,&chain_code_str);
          cfd::core::ExtPrivkey::ExtPrivkey
                    ((ExtPrivkey *)&extpubkey,net_type,&parent_privkey,&privkey,
                     (ByteData256 *)&local_150,depth,child_number);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_150);
          cfd::core::ExtPrivkey::ToString_abi_cxx11_(&local_150,(ExtPrivkey *)&extpubkey);
          pcVar2 = cfd::capi::CreateString(&local_150);
          *extkey = pcVar2;
          std::__cxx11::string::~string((string *)&local_150);
          cfd::core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)&extpubkey);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&parent_privkey)
          ;
        }
        else {
          cfd::core::ByteData::ByteData(&parent_privkey.data_,&fingerprint_str);
          cfd::core::ByteData256::ByteData256((ByteData256 *)&local_150,&chain_code_str);
          cfd::core::ExtPrivkey::ExtPrivkey
                    ((ExtPrivkey *)&extpubkey,net_type,&parent_privkey.data_,&privkey,
                     (ByteData256 *)&local_150,depth,child_number);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_150);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&parent_privkey)
          ;
          cfd::core::ExtPrivkey::ToString_abi_cxx11_
                    ((string *)&parent_privkey,(ExtPrivkey *)&extpubkey);
          pcVar2 = cfd::capi::CreateString((string *)&parent_privkey);
          *extkey = pcVar2;
          std::__cxx11::string::~string((string *)&parent_privkey);
          cfd::core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)&extpubkey);
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&privkey);
      }
      else {
        if (fingerprint_str._M_string_length == 0) {
          cfd::core::Pubkey::Pubkey((Pubkey *)&privkey,&parent_key_str);
          cfd::core::Pubkey::Pubkey((Pubkey *)&parent_privkey,&key_str);
          cfd::core::ByteData256::ByteData256((ByteData256 *)&local_150,&chain_code_str);
          cfd::core::ExtPubkey::ExtPubkey
                    (&extpubkey,net_type,(Pubkey *)&privkey,(Pubkey *)&parent_privkey,
                     (ByteData256 *)&local_150,depth,child_number);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_150);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&parent_privkey)
          ;
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&privkey);
          cfd::core::ExtPubkey::ToString_abi_cxx11_((string *)&privkey,&extpubkey);
          pcVar2 = cfd::capi::CreateString((string *)&privkey);
        }
        else {
          cfd::core::ByteData::ByteData(&privkey.data_,&fingerprint_str);
          cfd::core::Pubkey::Pubkey((Pubkey *)&parent_privkey,&key_str);
          cfd::core::ByteData256::ByteData256((ByteData256 *)&local_150,&chain_code_str);
          cfd::core::ExtPubkey::ExtPubkey
                    (&extpubkey,net_type,&privkey.data_,(Pubkey *)&parent_privkey,
                     (ByteData256 *)&local_150,depth,child_number);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_150);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&parent_privkey)
          ;
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&privkey);
          cfd::core::ExtPubkey::ToString_abi_cxx11_((string *)&privkey,&extpubkey);
          pcVar2 = cfd::capi::CreateString((string *)&privkey);
        }
        *extkey = pcVar2;
        std::__cxx11::string::~string((string *)&privkey);
        cfd::core::ExtPubkey::~ExtPubkey(&extpubkey);
      }
      std::__cxx11::string::~string((string *)&fingerprint_str);
      std::__cxx11::string::~string((string *)&parent_key_str);
      std::__cxx11::string::~string((string *)&chain_code_str);
      std::__cxx11::string::~string((string *)&key_str);
      return 0;
    }
    extpubkey.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    extpubkey.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish._0_4_ = 0x6bc;
    extpubkey.serialize_data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = "CfdCreateExtkey";
    cfd::core::logger::warn<>((CfdSourceLocation *)&extpubkey,"privkey\'s network_type is invalid.")
    ;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&extpubkey,"Failed to parameter. privkey\'s network_type is invalid.",
               (allocator *)&key_str);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&extpubkey);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  extpubkey.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
  extpubkey.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x6b3;
  extpubkey.serialize_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdCreateExtkey";
  cfd::core::logger::warn<>((CfdSourceLocation *)&extpubkey,"key is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&extpubkey,"Failed to parameter. key is null or empty.",(allocator *)&key_str
            );
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&extpubkey);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

CFDC_API int CfdCreateExtkey(
    void* handle, int network_type, int key_type, const char* parent_key,
    const char* fingerprint, const char* key, const char* chain_code,
    unsigned char depth, uint32_t child_number, char** extkey) {
  try {
    cfd::Initialize();
    if (extkey == nullptr) {
      warn(CFD_LOG_SOURCE, "extkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. extkey is null.");
    }
    if (IsEmptyString(key)) {
      warn(CFD_LOG_SOURCE, "key is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. key is null or empty.");
    }

    bool is_bitcoin = true;
    cfd::core::NetType net_type = ConvertNetType(network_type, &is_bitcoin);
    if (!is_bitcoin) {
      warn(CFD_LOG_SOURCE, "privkey's network_type is invalid.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey's network_type is invalid.");
    }
    std::string key_str = key;
    std::string chain_code_str = chain_code;
    std::string parent_key_str;
    if (!IsEmptyString(parent_key)) {
      parent_key_str = parent_key;
    }
    std::string fingerprint_str;
    if (!IsEmptyString(fingerprint)) {
      fingerprint_str = fingerprint;
    }

    if (key_type == ExtKeyType::kExtPrivkey) {
      Privkey privkey;
      if (key_str.size() == (Privkey::kPrivkeySize * 2)) {
        privkey = Privkey(key_str);
      } else {
        privkey = Privkey::FromWif(key_str, net_type);
      }
      if (fingerprint_str.empty()) {
        Privkey parent_privkey;
        if (parent_key_str.size() == (Privkey::kPrivkeySize * 2)) {
          parent_privkey = Privkey(parent_key_str);
        } else {
          parent_privkey = Privkey::FromWif(parent_key_str, net_type);
        }
        ExtPrivkey extprivkey(
            net_type, parent_privkey, privkey, ByteData256(chain_code_str),
            depth, child_number);
        *extkey = CreateString(extprivkey.ToString());
      } else {
        ExtPrivkey extprivkey(
            net_type, ByteData(fingerprint_str), privkey,
            ByteData256(chain_code_str), depth, child_number);
        *extkey = CreateString(extprivkey.ToString());
      }
    } else {
      if (fingerprint_str.empty()) {
        ExtPubkey extpubkey(
            net_type, Pubkey(parent_key_str), Pubkey(key_str),
            ByteData256(chain_code_str), depth, child_number);
        *extkey = CreateString(extpubkey.ToString());
      } else {
        ExtPubkey extpubkey(
            net_type, ByteData(fingerprint_str), Pubkey(key_str),
            ByteData256(chain_code_str), depth, child_number);
        *extkey = CreateString(extpubkey.ToString());
      }
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}